

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O0

void test_ibuf_consume(void)

{
  char *pcVar1;
  size_t sVar2;
  char *pos;
  ibuf ibuf;
  
  plan(4);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_consume");
  ibuf_create((ibuf *)&pos,&cache,0x400);
  ibuf_alloc((ibuf *)&pos,0x200);
  pcVar1 = ibuf.rpos;
  ibuf_consume((ibuf *)&pos,200);
  _ok((uint)(ibuf.rpos == pcVar1),"ibuf.wpos == pos",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xaf,
      "line %d");
  sVar2 = ibuf_used((ibuf *)&pos);
  _ok((uint)(sVar2 == 0x138),"ibuf_used(&ibuf) == 312",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xb0,
      "line %d");
  ibuf_consume((ibuf *)&pos,0x138);
  _ok((uint)(ibuf.rpos == pcVar1),"ibuf.wpos == pos",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xb2,
      "line %d");
  sVar2 = ibuf_used((ibuf *)&pos);
  _ok((uint)(sVar2 == 0),"ibuf_used(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xb3,
      "line %d");
  ibuf_destroy((ibuf *)&pos);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_ibuf_consume");
  check_plan();
  return;
}

Assistant:

static void
test_ibuf_consume(void)
{
	plan(4);
	header();

	struct ibuf ibuf;
	ibuf_create(&ibuf, &cache, 1024);
	ibuf_alloc(&ibuf, 512);
	char *pos = ibuf.wpos;
	ibuf_consume(&ibuf, 200);
	ok(ibuf.wpos == pos);
	ok(ibuf_used(&ibuf) == 312);
	ibuf_consume(&ibuf, 312);
	ok(ibuf.wpos == pos);
	ok(ibuf_used(&ibuf) == 0);
	ibuf_destroy(&ibuf);

	footer();
	check_plan();
}